

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLExportTest_writeNodeHeaderTest_Test::TestBody
          (OpenDDLExportTest_writeNodeHeaderTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  DDLNode *this_00;
  char *in_R9;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_170;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  DDLNode *local_a0;
  DDLNode *node;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  undefined1 local_48 [8];
  string statement;
  undefined1 local_20 [7];
  bool ok;
  OpenDDLExportMock myExport;
  OpenDDLExportTest_writeNodeHeaderTest_Test *this_local;
  
  myExport.super_OpenDDLExport.m_stream = (IOStreamBase *)this;
  OpenDDLExportMock::OpenDDLExportMock((OpenDDLExportMock *)local_20);
  statement.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_48);
  statement.field_2._M_local_buf[0xf] =
       OpenDDLExportMock::writeNodeHeaderTester
                 ((OpenDDLExportMock *)local_20,(DDLNode *)0x0,(string *)local_48);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_68,(bool)(~statement.field_2._M_local_buf[0xf] & 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&node,(internal *)local_68,(AssertionResult *)"ok","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&node);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"test",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"",(allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  this_00 = DDLNode::create(&local_c0,&local_e8,(DDLNode *)0x0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_a0 = this_00;
  DDLNode::attachParent(this_00,(this->super_OpenDDLExportTest).m_root);
  statement.field_2._M_local_buf[0xf] =
       OpenDDLExportMock::writeNodeHeaderTester
                 ((OpenDDLExportMock *)local_20,local_a0,(string *)local_48);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_100,(bool)statement.field_2._M_local_buf[0xf]);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_100,(AssertionResult *)"ok","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((EqHelper<false> *)local_140,"\"test\"","statement",(char (*) [5])0x1a0429,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  std::__cxx11::string::clear();
  statement.field_2._M_local_buf[0xf] =
       OpenDDLExportMock::writeNodeHeaderTester
                 ((OpenDDLExportMock *)local_20,(this->super_OpenDDLExportTest).m_root,
                  (string *)local_48);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_160,(bool)statement.field_2._M_local_buf[0xf]);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_160,(AssertionResult *)"ok","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((EqHelper<false> *)local_1a0,"\"test $root\"","statement",(char (*) [11])"test $root",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  std::__cxx11::string::~string((string *)local_48);
  OpenDDLExportMock::~OpenDDLExportMock((OpenDDLExportMock *)local_20);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeNodeHeaderTest) {
    OpenDDLExportMock myExport;

    bool ok(true);
    std::string statement;
    ok = myExport.writeNodeHeaderTester(nullptr, statement);
    EXPECT_FALSE(ok);

    DDLNode *node(DDLNode::create("test", ""));
    node->attachParent(m_root);
    ok = myExport.writeNodeHeaderTester(node, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("test", statement);
    statement.clear();

    ok = myExport.writeNodeHeaderTester(m_root, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("test $root", statement);
}